

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSharedPtr.hpp
# Opt level: O0

void __thiscall
de::
SharedPtr<de::details::UniquePtr<vkt::sr::ShaderRenderCaseInstance::UniformInfo,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::UniformInfo>_>_>
::SharedPtr(SharedPtr<de::details::UniquePtr<vkt::sr::ShaderRenderCaseInstance::UniformInfo,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::UniformInfo>_>_>
            *this,UniquePtr<vkt::sr::ShaderRenderCaseInstance::UniformInfo,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::UniformInfo>_>
                  *ptr)

{
  UniquePtr<vkt::sr::ShaderRenderCaseInstance::UniformInfo,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::UniformInfo>_>
  *pUVar1;
  SharedPtrState<de::details::UniquePtr<vkt::sr::ShaderRenderCaseInstance::UniformInfo,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::UniformInfo>_>,_de::DefaultDeleter<de::details::UniquePtr<vkt::sr::ShaderRenderCaseInstance::UniformInfo,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::UniformInfo>_>_>_>
  *pSVar2;
  DefaultDeleter<de::details::UniquePtr<vkt::sr::ShaderRenderCaseInstance::UniformInfo,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::UniformInfo>_>_>
  local_25 [13];
  UniquePtr<vkt::sr::ShaderRenderCaseInstance::UniformInfo,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::UniformInfo>_>
  *local_18;
  UniquePtr<vkt::sr::ShaderRenderCaseInstance::UniformInfo,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::UniformInfo>_>
  *ptr_local;
  SharedPtr<de::details::UniquePtr<vkt::sr::ShaderRenderCaseInstance::UniformInfo,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::UniformInfo>_>_>
  *this_local;
  
  this->m_ptr = (UniquePtr<vkt::sr::ShaderRenderCaseInstance::UniformInfo,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::UniformInfo>_>
                 *)0x0;
  this->m_state = (SharedPtrStateBase *)0x0;
  this->m_ptr = ptr;
  local_18 = ptr;
  ptr_local = (UniquePtr<vkt::sr::ShaderRenderCaseInstance::UniformInfo,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::UniformInfo>_>
               *)this;
  pSVar2 = (SharedPtrState<de::details::UniquePtr<vkt::sr::ShaderRenderCaseInstance::UniformInfo,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::UniformInfo>_>,_de::DefaultDeleter<de::details::UniquePtr<vkt::sr::ShaderRenderCaseInstance::UniformInfo,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::UniformInfo>_>_>_>
            *)operator_new(0x20);
  pUVar1 = local_18;
  DefaultDeleter<de::details::UniquePtr<vkt::sr::ShaderRenderCaseInstance::UniformInfo,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::UniformInfo>_>_>
  ::DefaultDeleter(local_25);
  SharedPtrState<de::details::UniquePtr<vkt::sr::ShaderRenderCaseInstance::UniformInfo,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::UniformInfo>_>,_de::DefaultDeleter<de::details::UniquePtr<vkt::sr::ShaderRenderCaseInstance::UniformInfo,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::UniformInfo>_>_>_>
  ::SharedPtrState(pSVar2,pUVar1);
  this->m_state = (SharedPtrStateBase *)pSVar2;
  this->m_state->strongRefCount = 1;
  this->m_state->weakRefCount = 1;
  return;
}

Assistant:

inline SharedPtr<T>::SharedPtr (T* ptr)
	: m_ptr		(DE_NULL)
	, m_state	(DE_NULL)
{
	try
	{
		m_ptr	= ptr;
		m_state	= new SharedPtrState<T, DefaultDeleter<T> >(ptr, DefaultDeleter<T>());
		m_state->strongRefCount	= 1;
		m_state->weakRefCount	= 1;
	}
	catch (...)
	{
		// \note ptr is not released.
		delete m_state;
		throw;
	}
}